

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv_tcp_nodelay(uv_tcp_t *handle,int on)

{
  int iVar1;
  
  iVar1 = (handle->io_watcher).fd;
  if ((iVar1 != -1) && (iVar1 = uv__tcp_nodelay(iVar1,on), iVar1 != 0)) {
    return iVar1;
  }
  handle->flags = (uint)(on != 0) << 10 | handle->flags & 0xfffffbff;
  return 0;
}

Assistant:

int uv_tcp_nodelay(uv_tcp_t* handle, int on) {
  int err;

  if (uv__stream_fd(handle) != -1) {
    err = uv__tcp_nodelay(uv__stream_fd(handle), on);
    if (err)
      return err;
  }

  if (on)
    handle->flags |= UV_TCP_NODELAY;
  else
    handle->flags &= ~UV_TCP_NODELAY;

  return 0;
}